

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool __thiscall
cmInstallCommand::HandleDirectoryMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  byte bVar1;
  bool bVar2;
  MessageLevel message_00;
  size_type sVar3;
  const_reference pvVar4;
  size_type sVar5;
  char *pcVar6;
  ostream *poVar7;
  cmInstallDirectoryGenerator *this_01;
  char *dir_permissions;
  char *component_00;
  char *literal_args_00;
  cmGlobalGenerator *this_02;
  undefined1 local_1e48 [4];
  MessageLevel message;
  undefined1 local_1e28 [8];
  ostringstream e_17;
  allocator local_1ca9;
  value_type local_1ca8;
  string local_1c88;
  undefined1 local_1c68 [8];
  ostringstream e_16;
  string local_1af0;
  undefined1 local_1ad0 [8];
  ostringstream e_15;
  string local_1958;
  undefined1 local_1938 [8];
  ostringstream e_14;
  string local_17c0;
  undefined1 local_17a0 [8];
  ostringstream e_13;
  undefined1 local_1628 [8];
  string regex_1;
  string regex;
  undefined1 local_15c8 [8];
  ostringstream e_12;
  size_type gpos;
  string dir;
  undefined1 local_1408 [8];
  ostringstream e_11;
  string local_1290;
  undefined1 local_1270 [8];
  ostringstream e_10;
  string local_10f8;
  undefined1 local_10d8 [8];
  ostringstream e_9;
  string local_f60;
  undefined1 local_f40 [8];
  ostringstream e_8;
  string local_dc8;
  undefined1 local_da8 [8];
  ostringstream e_7;
  string local_c30;
  undefined1 local_c10 [8];
  ostringstream e_6;
  string local_a98;
  undefined1 local_a78 [8];
  ostringstream e_5;
  string local_900;
  undefined1 local_8e0 [8];
  ostringstream e_4;
  string local_768;
  undefined1 local_748 [8];
  ostringstream e_3;
  string local_5d0;
  undefined1 local_5b0 [8];
  ostringstream e_2;
  string local_438;
  undefined1 local_418 [8];
  ostringstream e_1;
  string local_298;
  undefined1 local_278 [8];
  ostringstream e;
  uint local_fc;
  undefined1 local_f8 [4];
  uint i;
  string literal_args;
  string local_c8 [8];
  string component;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  string permissions_dir;
  string permissions_file;
  char *destination;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  bool message_never;
  bool exclude_from_all;
  bool optional;
  bool in_match_mode;
  Doing doing;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmInstallCommand *this_local;
  
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&destination);
  permissions_file.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(permissions_dir.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &configurations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&component.field_2 + 8));
  std::__cxx11::string::string(local_c8,(string *)&this->DefaultComponentName);
  std::__cxx11::string::string((string *)local_f8);
  local_fc = 1;
  do {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar3 <= local_fc) {
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&destination);
      if ((bVar2) && (permissions_file.field_2._8_8_ != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1ca8,"",&local_1ca9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&destination,&local_1ca8);
        std::__cxx11::string::~string((string *)&local_1ca8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1ca9);
      }
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&destination);
      if (bVar2) {
        this_local._7_1_ = 1;
      }
      else if (permissions_file.field_2._8_8_ == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e28);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        poVar7 = std::operator<<((ostream *)local_1e28,(string *)pvVar4);
        std::operator<<(poVar7," given no DESTINATION!");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)local_1e48);
        std::__cxx11::string::~string((string *)local_1e48);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e28);
      }
      else {
        message_00 = cmInstallGenerator::SelectMessageLevel
                               ((this->super_cmCommand).Makefile,
                                (bool)((byte)dirs.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage & 1)
                               );
        this_00 = (this->super_cmCommand).Makefile;
        this_01 = (cmInstallDirectoryGenerator *)operator_new(0x140);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        dir_permissions = (char *)std::__cxx11::string::c_str();
        component_00 = (char *)std::__cxx11::string::c_str();
        bVar1 = dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_;
        literal_args_00 = (char *)std::__cxx11::string::c_str();
        cmInstallDirectoryGenerator::cmInstallDirectoryGenerator
                  (this_01,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&destination,(char *)permissions_file.field_2._8_8_,pcVar6,
                   dir_permissions,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&component.field_2 + 8),component_00,message_00,(bool)(bVar1 & 1),
                   literal_args_00,
                   (bool)(dirs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1));
        cmMakefile::AddInstallGenerator(this_00,(cmInstallGenerator *)this_01);
        this_02 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmGlobalGenerator::AddInstallComponent(this_02,pcVar6);
        this_local._7_1_ = 1;
      }
LAB_006e4ade:
      std::__cxx11::string::~string((string *)local_f8);
      std::__cxx11::string::~string(local_c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&component.field_2 + 8));
      std::__cxx11::string::~string
                ((string *)
                 &configurations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)(permissions_dir.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&destination);
      return (bool)(this_local._7_1_ & 1);
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)local_fc);
    bVar2 = std::operator==(pvVar4,"DESTINATION");
    if (bVar2) {
      if ((dirs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        poVar7 = std::operator<<((ostream *)local_278,(string *)pvVar4);
        poVar7 = std::operator<<(poVar7," does not allow \"");
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_fc);
        poVar7 = std::operator<<(poVar7,(string *)pvVar4);
        std::operator<<(poVar7,"\" after PATTERN or REGEX.");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
        goto LAB_006e4ade;
      }
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)local_fc);
      bVar2 = std::operator==(pvVar4,"OPTIONAL");
      if (bVar2) {
        if ((dirs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,0);
          poVar7 = std::operator<<((ostream *)local_418,(string *)pvVar4);
          poVar7 = std::operator<<(poVar7," does not allow \"");
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)local_fc);
          poVar7 = std::operator<<(poVar7,(string *)pvVar4);
          std::operator<<(poVar7,"\" after PATTERN or REGEX.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,&local_438);
          std::__cxx11::string::~string((string *)&local_438);
          this_local._7_1_ = 0;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
          goto LAB_006e4ade;
        }
        dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
        dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_fc);
        bVar2 = std::operator==(pvVar4,"MESSAGE_NEVER");
        if (bVar2) {
          if ((dirs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,0);
            poVar7 = std::operator<<((ostream *)local_5b0,(string *)pvVar4);
            poVar7 = std::operator<<(poVar7," does not allow \"");
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)local_fc);
            poVar7 = std::operator<<(poVar7,(string *)pvVar4);
            std::operator<<(poVar7,"\" after PATTERN or REGEX.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,&local_5d0);
            std::__cxx11::string::~string((string *)&local_5d0);
            this_local._7_1_ = 0;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
            goto LAB_006e4ade;
          }
          dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
          dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
        else {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)local_fc);
          bVar2 = std::operator==(pvVar4,"PATTERN");
          if (bVar2) {
            dirs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
            dirs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)local_fc);
            bVar2 = std::operator==(pvVar4,"REGEX");
            if (bVar2) {
              dirs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
              dirs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
            }
            else {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)local_fc);
              bVar2 = std::operator==(pvVar4,"EXCLUDE");
              if (bVar2) {
                if ((((dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) ||
                    (dirs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 3)) ||
                   (dirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 4)) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_748);
                  pvVar4 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](args,0);
                  poVar7 = std::operator<<((ostream *)local_748,(string *)pvVar4);
                  poVar7 = std::operator<<(poVar7," does not allow \"");
                  pvVar4 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](args,(ulong)local_fc);
                  poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                  std::operator<<(poVar7,"\" before a PATTERN or REGEX is given.");
                  std::__cxx11::ostringstream::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_768);
                  std::__cxx11::string::~string((string *)&local_768);
                  this_local._7_1_ = 0;
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_748);
                  goto LAB_006e4ade;
                }
                std::__cxx11::string::operator+=((string *)local_f8," EXCLUDE");
                dirs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
              }
              else {
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,(ulong)local_fc);
                bVar2 = std::operator==(pvVar4,"PERMISSIONS");
                if (bVar2) {
                  if ((dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8e0);
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](args,0);
                    poVar7 = std::operator<<((ostream *)local_8e0,(string *)pvVar4);
                    poVar7 = std::operator<<(poVar7," does not allow \"");
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](args,(ulong)local_fc);
                    poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                    std::operator<<(poVar7,"\" before a PATTERN or REGEX is given.");
                    std::__cxx11::ostringstream::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_900);
                    std::__cxx11::string::~string((string *)&local_900);
                    this_local._7_1_ = 0;
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8e0);
                    goto LAB_006e4ade;
                  }
                  std::__cxx11::string::operator+=((string *)local_f8," PERMISSIONS");
                  dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 7;
                }
                else {
                  pvVar4 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](args,(ulong)local_fc);
                  bVar2 = std::operator==(pvVar4,"FILE_PERMISSIONS");
                  if (bVar2) {
                    if ((dirs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a78);
                      pvVar4 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](args,0);
                      poVar7 = std::operator<<((ostream *)local_a78,(string *)pvVar4);
                      poVar7 = std::operator<<(poVar7," does not allow \"");
                      pvVar4 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](args,(ulong)local_fc);
                      poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                      std::operator<<(poVar7,"\" after PATTERN or REGEX.");
                      std::__cxx11::ostringstream::str();
                      cmCommand::SetError(&this->super_cmCommand,&local_a98);
                      std::__cxx11::string::~string((string *)&local_a98);
                      this_local._7_1_ = 0;
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a78);
                      goto LAB_006e4ade;
                    }
                    dirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
                  }
                  else {
                    pvVar4 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](args,(ulong)local_fc);
                    bVar2 = std::operator==(pvVar4,"DIRECTORY_PERMISSIONS");
                    if (bVar2) {
                      if ((dirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c10);
                        pvVar4 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[](args,0);
                        poVar7 = std::operator<<((ostream *)local_c10,(string *)pvVar4);
                        poVar7 = std::operator<<(poVar7," does not allow \"");
                        pvVar4 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[](args,(ulong)local_fc);
                        poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                        std::operator<<(poVar7,"\" after PATTERN or REGEX.");
                        std::__cxx11::ostringstream::str();
                        cmCommand::SetError(&this->super_cmCommand,&local_c30);
                        std::__cxx11::string::~string((string *)&local_c30);
                        this_local._7_1_ = 0;
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c10);
                        goto LAB_006e4ade;
                      }
                      dirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 6;
                    }
                    else {
                      pvVar4 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](args,(ulong)local_fc);
                      bVar2 = std::operator==(pvVar4,"USE_SOURCE_PERMISSIONS");
                      if (bVar2) {
                        if ((dirs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_da8);
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[](args,0);
                          poVar7 = std::operator<<((ostream *)local_da8,(string *)pvVar4);
                          poVar7 = std::operator<<(poVar7," does not allow \"");
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[](args,(ulong)local_fc);
                          poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                          std::operator<<(poVar7,"\" after PATTERN or REGEX.");
                          std::__cxx11::ostringstream::str();
                          cmCommand::SetError(&this->super_cmCommand,&local_dc8);
                          std::__cxx11::string::~string((string *)&local_dc8);
                          this_local._7_1_ = 0;
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_da8);
                          goto LAB_006e4ade;
                        }
                        std::__cxx11::string::operator+=
                                  ((string *)local_f8," USE_SOURCE_PERMISSIONS");
                        dirs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      }
                      else {
                        pvVar4 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::operator[](args,(ulong)local_fc);
                        bVar2 = std::operator==(pvVar4,"FILES_MATCHING");
                        if (bVar2) {
                          if ((dirs.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f40);
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[](args,0);
                            poVar7 = std::operator<<((ostream *)local_f40,(string *)pvVar4);
                            poVar7 = std::operator<<(poVar7," does not allow \"");
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[](args,(ulong)local_fc);
                            poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                            std::operator<<(poVar7,"\" after PATTERN or REGEX.");
                            std::__cxx11::ostringstream::str();
                            cmCommand::SetError(&this->super_cmCommand,&local_f60);
                            std::__cxx11::string::~string((string *)&local_f60);
                            this_local._7_1_ = 0;
                            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f40);
                            goto LAB_006e4ade;
                          }
                          std::__cxx11::string::operator+=((string *)local_f8," FILES_MATCHING");
                          dirs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                        }
                        else {
                          pvVar4 = std::
                                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ::operator[](args,(ulong)local_fc);
                          bVar2 = std::operator==(pvVar4,"CONFIGURATIONS");
                          if (bVar2) {
                            if ((dirs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0)
                            {
                              std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)local_10d8);
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,0);
                              poVar7 = std::operator<<((ostream *)local_10d8,(string *)pvVar4);
                              poVar7 = std::operator<<(poVar7," does not allow \"");
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_fc);
                              poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                              std::operator<<(poVar7,"\" after PATTERN or REGEX.");
                              std::__cxx11::ostringstream::str();
                              cmCommand::SetError(&this->super_cmCommand,&local_10f8);
                              std::__cxx11::string::~string((string *)&local_10f8);
                              this_local._7_1_ = 0;
                              std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_10d8);
                              goto LAB_006e4ade;
                            }
                            dirs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 8;
                          }
                          else {
                            pvVar4 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::operator[](args,(ulong)local_fc);
                            bVar2 = std::operator==(pvVar4,"COMPONENT");
                            if (bVar2) {
                              if ((dirs.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) !=
                                  0) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_1270);
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,0);
                                poVar7 = std::operator<<((ostream *)local_1270,(string *)pvVar4);
                                poVar7 = std::operator<<(poVar7," does not allow \"");
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_fc);
                                poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                                std::operator<<(poVar7,"\" after PATTERN or REGEX.");
                                std::__cxx11::ostringstream::str();
                                cmCommand::SetError(&this->super_cmCommand,&local_1290);
                                std::__cxx11::string::~string((string *)&local_1290);
                                this_local._7_1_ = 0;
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_1270);
                                goto LAB_006e4ade;
                              }
                              dirs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 9;
                            }
                            else {
                              pvVar4 = std::
                                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::operator[](args,(ulong)local_fc);
                              bVar2 = std::operator==(pvVar4,"EXCLUDE_FROM_ALL");
                              if (bVar2) {
                                if ((dirs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1)
                                    != 0) {
                                  std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_1408);
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,0);
                                  poVar7 = std::operator<<((ostream *)local_1408,(string *)pvVar4);
                                  poVar7 = std::operator<<(poVar7," does not allow \"");
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_fc);
                                  poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                                  std::operator<<(poVar7,"\" after PATTERN or REGEX.");
                                  std::__cxx11::ostringstream::str();
                                  cmCommand::SetError(&this->super_cmCommand,
                                                      (string *)((long)&dir.field_2 + 8));
                                  std::__cxx11::string::~string
                                            ((string *)(dir.field_2._M_local_buf + 8));
                                  this_local._7_1_ = 0;
                                  std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_1408);
                                  goto LAB_006e4ade;
                                }
                                dirs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = 1;
                                dirs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                              }
                              else if (dirs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 1
                                      ) {
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_fc);
                                std::__cxx11::string::string((string *)&gpos,(string *)pvVar4);
                                sVar5 = cmGeneratorExpression::Find((string *)&gpos);
                                if (sVar5 != 0) {
                                  pcVar6 = (char *)std::__cxx11::string::c_str();
                                  bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar6);
                                  if (!bVar2) {
                                    pcVar6 = cmMakefile::GetCurrentSourceDirectory
                                                       ((this->super_cmCommand).Makefile);
                                    std::__cxx11::string::operator=((string *)&gpos,pcVar6);
                                    std::__cxx11::string::operator+=((string *)&gpos,"/");
                                    pvVar4 = std::
                                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::operator[](args,(ulong)local_fc);
                                    std::__cxx11::string::operator+=
                                              ((string *)&gpos,(string *)pvVar4);
                                  }
                                }
                                pcVar6 = (char *)std::__cxx11::string::c_str();
                                bVar2 = cmsys::SystemTools::FileExists(pcVar6);
                                if ((!bVar2) ||
                                   (bVar2 = cmsys::SystemTools::FileIsDirectory((string *)&gpos),
                                   bVar2)) {
                                  std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               *)&destination,(value_type *)&gpos);
                                  bVar2 = false;
                                }
                                else {
                                  std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_15c8);
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,0);
                                  poVar7 = std::operator<<((ostream *)local_15c8,(string *)pvVar4);
                                  poVar7 = std::operator<<(poVar7," given non-directory \"");
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_fc);
                                  poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                                  std::operator<<(poVar7,"\" to install.");
                                  std::__cxx11::ostringstream::str();
                                  cmCommand::SetError(&this->super_cmCommand,
                                                      (string *)((long)&regex.field_2 + 8));
                                  std::__cxx11::string::~string
                                            ((string *)(regex.field_2._M_local_buf + 8));
                                  this_local._7_1_ = 0;
                                  bVar2 = true;
                                  std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_15c8);
                                }
                                std::__cxx11::string::~string((string *)&gpos);
                                if (bVar2) goto LAB_006e4ade;
                              }
                              else if (dirs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 8
                                      ) {
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_fc);
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)((long)&component.field_2 + 8),pvVar4);
                              }
                              else if (dirs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 2
                                      ) {
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[](args,(ulong)local_fc);
                                permissions_file.field_2._8_8_ = std::__cxx11::string::c_str();
                                dirs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                              }
                              else if (dirs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 3
                                      ) {
                                std::__cxx11::string::operator+=((string *)local_f8," REGEX \"/");
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_fc);
                                cmsys::Glob::PatternToRegex
                                          ((string *)((long)&regex_1.field_2 + 8),pvVar4,false,false
                                          );
                                cmsys::SystemTools::ReplaceString
                                          ((string *)((long)&regex_1.field_2 + 8),"\\","\\\\");
                                std::__cxx11::string::operator+=
                                          ((string *)local_f8,
                                           (string *)(regex_1.field_2._M_local_buf + 8));
                                std::__cxx11::string::operator+=((string *)local_f8,"$\"");
                                dirs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                                std::__cxx11::string::~string
                                          ((string *)(regex_1.field_2._M_local_buf + 8));
                              }
                              else if (dirs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 4
                                      ) {
                                std::__cxx11::string::operator+=((string *)local_f8," REGEX \"");
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_fc);
                                std::__cxx11::string::string((string *)local_1628,(string *)pvVar4);
                                cmsys::SystemTools::ReplaceString((string *)local_1628,"\\","\\\\");
                                std::__cxx11::string::operator+=
                                          ((string *)local_f8,(string *)local_1628);
                                std::__cxx11::string::operator+=((string *)local_f8,"\"");
                                dirs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                                std::__cxx11::string::~string((string *)local_1628);
                              }
                              else if (dirs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 9
                                      ) {
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_fc);
                                std::__cxx11::string::operator=(local_c8,(string *)pvVar4);
                                dirs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                              }
                              else if (dirs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 5
                                      ) {
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_fc);
                                bVar2 = cmInstallCommandArguments::CheckPermissions
                                                  (pvVar4,(string *)
                                                          ((long)&permissions_dir.field_2 + 8));
                                if (!bVar2) {
                                  std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_17a0);
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,0);
                                  poVar7 = std::operator<<((ostream *)local_17a0,(string *)pvVar4);
                                  poVar7 = std::operator<<(poVar7,
                                                  " given invalid file permission \"");
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_fc);
                                  poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                                  std::operator<<(poVar7,"\".");
                                  std::__cxx11::ostringstream::str();
                                  cmCommand::SetError(&this->super_cmCommand,&local_17c0);
                                  std::__cxx11::string::~string((string *)&local_17c0);
                                  this_local._7_1_ = 0;
                                  std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_17a0);
                                  goto LAB_006e4ade;
                                }
                              }
                              else if (dirs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 6
                                      ) {
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_fc);
                                bVar2 = cmInstallCommandArguments::CheckPermissions
                                                  (pvVar4,(string *)
                                                          &configurations.
                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                                if (!bVar2) {
                                  std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_1938);
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,0);
                                  poVar7 = std::operator<<((ostream *)local_1938,(string *)pvVar4);
                                  poVar7 = std::operator<<(poVar7,
                                                  " given invalid directory permission \"");
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_fc);
                                  poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                                  std::operator<<(poVar7,"\".");
                                  std::__cxx11::ostringstream::str();
                                  cmCommand::SetError(&this->super_cmCommand,&local_1958);
                                  std::__cxx11::string::~string((string *)&local_1958);
                                  this_local._7_1_ = 0;
                                  std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_1938);
                                  goto LAB_006e4ade;
                                }
                              }
                              else {
                                if (dirs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 7) {
                                  std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_1c68);
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,0);
                                  poVar7 = std::operator<<((ostream *)local_1c68,(string *)pvVar4);
                                  poVar7 = std::operator<<(poVar7," given unknown argument \"");
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_fc);
                                  poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                                  std::operator<<(poVar7,"\".");
                                  std::__cxx11::ostringstream::str();
                                  cmCommand::SetError(&this->super_cmCommand,&local_1c88);
                                  std::__cxx11::string::~string((string *)&local_1c88);
                                  this_local._7_1_ = 0;
                                  std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_1c68);
                                  goto LAB_006e4ade;
                                }
                                pvVar4 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::operator[](args,(ulong)local_fc);
                                bVar2 = cmInstallCommandArguments::CheckPermissions
                                                  (pvVar4,(string *)local_f8);
                                if (!bVar2) {
                                  std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_1ad0);
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,0);
                                  poVar7 = std::operator<<((ostream *)local_1ad0,(string *)pvVar4);
                                  poVar7 = std::operator<<(poVar7," given invalid permission \"");
                                  pvVar4 = std::
                                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::operator[](args,(ulong)local_fc);
                                  poVar7 = std::operator<<(poVar7,(string *)pvVar4);
                                  std::operator<<(poVar7,"\".");
                                  std::__cxx11::ostringstream::str();
                                  cmCommand::SetError(&this->super_cmCommand,&local_1af0);
                                  std::__cxx11::string::~string((string *)&local_1af0);
                                  this_local._7_1_ = 0;
                                  std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_1ad0);
                                  goto LAB_006e4ade;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_fc = local_fc + 1;
  } while( true );
}

Assistant:

bool cmInstallCommand::HandleDirectoryMode(
  std::vector<std::string> const& args)
{
  enum Doing
  {
    DoingNone,
    DoingDirs,
    DoingDestination,
    DoingPattern,
    DoingRegex,
    DoingPermsFile,
    DoingPermsDir,
    DoingPermsMatch,
    DoingConfigurations,
    DoingComponent
  };
  Doing doing = DoingDirs;
  bool in_match_mode = false;
  bool optional = false;
  bool exclude_from_all = false;
  bool message_never = false;
  std::vector<std::string> dirs;
  const char* destination = CM_NULLPTR;
  std::string permissions_file;
  std::string permissions_dir;
  std::vector<std::string> configurations;
  std::string component = this->DefaultComponentName;
  std::string literal_args;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "DESTINATION") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the destination property.
      doing = DoingDestination;
    } else if (args[i] == "OPTIONAL") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Mark the rule as optional.
      optional = true;
      doing = DoingNone;
    } else if (args[i] == "MESSAGE_NEVER") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Mark the rule as quiet.
      message_never = true;
      doing = DoingNone;
    } else if (args[i] == "PATTERN") {
      // Switch to a new pattern match rule.
      doing = DoingPattern;
      in_match_mode = true;
    } else if (args[i] == "REGEX") {
      // Switch to a new regex match rule.
      doing = DoingRegex;
      in_match_mode = true;
    } else if (args[i] == "EXCLUDE") {
      // Add this property to the current match rule.
      if (!in_match_mode || doing == DoingPattern || doing == DoingRegex) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" before a PATTERN or REGEX is given.";
        this->SetError(e.str());
        return false;
      }
      literal_args += " EXCLUDE";
      doing = DoingNone;
    } else if (args[i] == "PERMISSIONS") {
      if (!in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" before a PATTERN or REGEX is given.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the current match permissions property.
      literal_args += " PERMISSIONS";
      doing = DoingPermsMatch;
    } else if (args[i] == "FILE_PERMISSIONS") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the file permissions property.
      doing = DoingPermsFile;
    } else if (args[i] == "DIRECTORY_PERMISSIONS") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the directory permissions property.
      doing = DoingPermsDir;
    } else if (args[i] == "USE_SOURCE_PERMISSIONS") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Add this option literally.
      literal_args += " USE_SOURCE_PERMISSIONS";
      doing = DoingNone;
    } else if (args[i] == "FILES_MATCHING") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Add this option literally.
      literal_args += " FILES_MATCHING";
      doing = DoingNone;
    } else if (args[i] == "CONFIGURATIONS") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the configurations property.
      doing = DoingConfigurations;
    } else if (args[i] == "COMPONENT") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the component property.
      doing = DoingComponent;
    } else if (args[i] == "EXCLUDE_FROM_ALL") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }
      exclude_from_all = true;
      doing = DoingNone;
    } else if (doing == DoingDirs) {
      // Convert this directory to a full path.
      std::string dir = args[i];
      std::string::size_type gpos = cmGeneratorExpression::Find(dir);
      if (gpos != 0 && !cmSystemTools::FileIsFullPath(dir.c_str())) {
        dir = this->Makefile->GetCurrentSourceDirectory();
        dir += "/";
        dir += args[i];
      }

      // Make sure the name is a directory.
      if (cmSystemTools::FileExists(dir.c_str()) &&
          !cmSystemTools::FileIsDirectory(dir)) {
        std::ostringstream e;
        e << args[0] << " given non-directory \"" << args[i]
          << "\" to install.";
        this->SetError(e.str());
        return false;
      }

      // Store the directory for installation.
      dirs.push_back(dir);
    } else if (doing == DoingConfigurations) {
      configurations.push_back(args[i]);
    } else if (doing == DoingDestination) {
      destination = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingPattern) {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      literal_args += " REGEX \"/";
      std::string regex = cmsys::Glob::PatternToRegex(args[i], false);
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "$\"";
      doing = DoingNone;
    } else if (doing == DoingRegex) {
      literal_args += " REGEX \"";
// Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__) || defined(__CYGWIN__)
      std::string regex = cmSystemTools::LowerCase(args[i]);
#else
      std::string regex = args[i];
#endif
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "\"";
      doing = DoingNone;
    } else if (doing == DoingComponent) {
      component = args[i];
      doing = DoingNone;
    } else if (doing == DoingPermsFile) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       permissions_file)) {
        std::ostringstream e;
        e << args[0] << " given invalid file permission \"" << args[i]
          << "\".";
        this->SetError(e.str());
        return false;
      }
    } else if (doing == DoingPermsDir) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       permissions_dir)) {
        std::ostringstream e;
        e << args[0] << " given invalid directory permission \"" << args[i]
          << "\".";
        this->SetError(e.str());
        return false;
      }
    } else if (doing == DoingPermsMatch) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       literal_args)) {
        std::ostringstream e;
        e << args[0] << " given invalid permission \"" << args[i] << "\".";
        this->SetError(e.str());
        return false;
      }
    } else {
      // Unknown argument.
      std::ostringstream e;
      e << args[0] << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
    }
  }

  // Support installing an empty directory.
  if (dirs.empty() && destination) {
    dirs.push_back("");
  }

  // Check if there is something to do.
  if (dirs.empty()) {
    return true;
  }
  if (!destination) {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile, message_never);

  // Create the directory install generator.
  this->Makefile->AddInstallGenerator(new cmInstallDirectoryGenerator(
    dirs, destination, permissions_file.c_str(), permissions_dir.c_str(),
    configurations, component.c_str(), message, exclude_from_all,
    literal_args.c_str(), optional));

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()->AddInstallComponent(component.c_str());

  return true;
}